

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::populateDefaultShadersAndRules(GLEngine *this)

{
  initializer_list<polyscope::render::ShaderStageSpecification> __l;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_00;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_01;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_02;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_03;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_04;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_05;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_06;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_07;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_08;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_09;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_10;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_11;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_12;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_13;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_14;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_15;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_16;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_17;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_18;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_19;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_false,_true>,_bool>
  pVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  *in_stack_ffffffffffffb330;
  value_type *in_stack_ffffffffffffb338;
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  *in_stack_ffffffffffffb340;
  ShaderStageSpecification *in_stack_ffffffffffffb358;
  ShaderReplacementRule *in_stack_ffffffffffffb360;
  iterator in_stack_ffffffffffffb368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  *in_stack_ffffffffffffb370;
  undefined1 **local_4420;
  undefined1 **local_43e8;
  undefined1 **local_43b0;
  undefined1 **local_4378;
  undefined1 **local_4340;
  undefined1 **local_4308;
  undefined1 **local_42d0;
  undefined1 **local_4298;
  undefined1 **local_4260;
  undefined1 **local_4228;
  undefined1 **local_41f0;
  undefined1 **local_41b8;
  undefined1 **local_4180;
  undefined1 **local_4148;
  undefined1 **local_4110;
  undefined1 **local_40d8;
  undefined1 **local_40a0;
  undefined1 **local_4068;
  undefined1 **local_4030;
  undefined1 **local_3ff8;
  undefined1 **local_3fc0;
  undefined1 *local_21e0 [28];
  undefined8 *local_2100;
  undefined8 local_20f8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_2078;
  undefined1 local_2070;
  undefined4 local_2068;
  undefined8 *local_2060;
  undefined1 *local_2058 [14];
  undefined1 local_1fe8 [112];
  undefined8 *local_1f78;
  undefined8 local_1f70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_1ef0;
  undefined1 local_1ee8;
  undefined4 local_1ee0;
  undefined8 *local_1ed8;
  undefined1 *local_1ed0 [14];
  undefined1 local_1e60 [112];
  undefined8 *local_1df0;
  undefined8 local_1de8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_1d68;
  undefined1 local_1d60;
  undefined4 local_1d58;
  undefined8 *local_1d50;
  undefined1 *local_1d48 [14];
  undefined1 local_1cd8 [112];
  undefined8 *local_1c68;
  undefined8 local_1c60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_1be0;
  undefined1 local_1bd8;
  undefined4 local_1bd0;
  undefined8 *local_1bc8;
  undefined1 *local_1bc0 [14];
  undefined1 local_1b50 [112];
  undefined8 *local_1ae0;
  undefined8 local_1ad8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_1a58;
  undefined1 local_1a50;
  undefined4 local_1a48;
  undefined8 *local_1a40;
  undefined1 *local_1a38 [14];
  undefined1 local_19c8 [112];
  undefined8 *local_1958;
  undefined8 local_1950;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_18d0;
  undefined1 local_18c8;
  undefined4 local_18c0;
  undefined8 *local_18b8;
  undefined1 *local_18b0 [14];
  undefined1 local_1840 [112];
  undefined8 *local_17d0;
  undefined8 local_17c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_1748;
  undefined1 local_1740;
  undefined4 local_1738;
  undefined8 *local_1730;
  undefined1 *local_1728 [14];
  undefined1 local_16b8 [112];
  undefined8 *local_1648;
  undefined8 local_1640;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_15c0;
  undefined1 local_15b8;
  undefined4 local_15b0;
  undefined8 *local_15a8;
  undefined1 *local_15a0 [14];
  undefined1 local_1530 [112];
  undefined8 *local_14c0;
  undefined8 local_14b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_1438;
  undefined1 local_1430;
  undefined4 local_1428;
  undefined8 *local_1420;
  undefined1 *local_1418 [14];
  undefined1 local_13a8 [112];
  undefined8 *local_1338;
  undefined8 local_1330;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_12b0;
  undefined1 local_12a8;
  undefined4 local_12a0;
  undefined8 *local_1298;
  undefined1 *local_1290 [14];
  undefined1 local_1220 [112];
  undefined8 *local_11b0;
  undefined8 local_11a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_1128;
  undefined1 local_1120;
  undefined4 local_1118;
  undefined8 *local_1110;
  undefined1 *local_1108 [14];
  undefined1 local_1098 [112];
  undefined1 local_1028 [112];
  undefined8 *local_fb8;
  undefined8 local_fb0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_f30;
  undefined1 local_f28;
  undefined4 local_f20;
  undefined8 *local_f18;
  undefined1 *local_f10 [14];
  undefined1 local_ea0 [112];
  undefined8 *local_e30;
  undefined8 local_e28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_da8;
  undefined1 local_da0;
  undefined4 local_d98;
  undefined8 *local_d90;
  undefined1 *local_d88 [14];
  undefined1 local_d18 [112];
  undefined8 *local_ca8;
  undefined8 local_ca0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_c20;
  undefined1 local_c18;
  undefined4 local_c10;
  undefined8 *local_c08;
  undefined1 *local_c00 [14];
  undefined1 local_b90 [112];
  undefined8 *local_b20;
  undefined8 local_b18;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_a98;
  undefined1 local_a90;
  undefined4 local_a88;
  undefined8 *local_a80;
  undefined1 *local_a78 [14];
  undefined1 local_a08 [112];
  undefined8 *local_998;
  undefined8 local_990;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_910;
  undefined1 local_908;
  undefined4 local_900;
  undefined8 *local_8f8;
  undefined1 *local_8f0 [14];
  undefined1 local_880 [112];
  undefined8 *local_810;
  undefined8 local_808;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_788;
  undefined1 local_780;
  undefined4 local_778;
  undefined8 *local_770;
  undefined1 *local_768 [14];
  undefined1 local_6f8 [112];
  undefined1 local_688 [112];
  undefined8 *local_618;
  undefined8 local_610;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_590;
  undefined1 local_588;
  undefined4 local_580;
  undefined8 *local_578;
  undefined1 *local_570 [14];
  undefined1 local_500 [112];
  undefined1 local_490 [112];
  undefined8 *local_420;
  undefined8 local_418;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_398;
  undefined1 local_390;
  undefined4 local_388;
  undefined8 *local_380;
  undefined1 *local_378 [14];
  undefined1 local_308 [112];
  undefined1 local_298 [112];
  undefined8 *local_228;
  undefined8 local_220;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_1a0;
  undefined1 local_198;
  undefined4 local_18c;
  undefined8 *local_178;
  undefined1 *local_170 [14];
  undefined1 local_100 [112];
  undefined8 *local_90;
  undefined8 local_88;
  
  local_178 = local_170;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_178 = (undefined8 *)local_100;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_90 = local_170;
  local_88 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e603a);
  __l._M_len = (size_type)in_stack_ffffffffffffb370;
  __l._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l,(allocator_type *)in_stack_ffffffffffffb358);
  local_18c = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[5],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [5])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_1a0._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_198 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e6107);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e6121);
  local_3fc0 = (undefined1 **)&local_90;
  do {
    local_3fc0 = local_3fc0 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_3fc0 != local_170);
  local_380 = local_378;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_380 = (undefined8 *)local_308;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_380 = (undefined8 *)local_298;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_228 = local_378;
  local_220 = 3;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e6216);
  __l_00._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_00._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_00,(allocator_type *)in_stack_ffffffffffffb358);
  local_388 = 0;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[15],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [15])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_398._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_390 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e62e3);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e62fd);
  local_3ff8 = (undefined1 **)&local_228;
  do {
    local_3ff8 = local_3ff8 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_3ff8 != local_378);
  local_578 = local_570;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_578 = (undefined8 *)local_500;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_578 = (undefined8 *)local_490;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_420 = local_570;
  local_418 = 3;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e63f2);
  __l_01._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_01._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_01,(allocator_type *)in_stack_ffffffffffffb358);
  local_580 = 0;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[15],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [15])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_590._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_588 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e64bf);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e64d9);
  local_4030 = (undefined1 **)&local_420;
  do {
    local_4030 = local_4030 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4030 != local_570);
  local_770 = local_768;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_770 = (undefined8 *)local_6f8;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_770 = (undefined8 *)local_688;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_618 = local_768;
  local_610 = 3;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e65ce);
  __l_02._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_02._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_02,(allocator_type *)in_stack_ffffffffffffb358);
  local_778 = 0;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[17],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [17])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_788._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_780 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e669b);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e66b5);
  local_4068 = (undefined1 **)&local_618;
  do {
    local_4068 = local_4068 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4068 != local_768);
  local_8f8 = local_8f0;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_8f8 = (undefined8 *)local_880;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_810 = local_8f0;
  local_808 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e678c);
  __l_03._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_03._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_03,(allocator_type *)in_stack_ffffffffffffb358);
  local_900 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[10],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [10])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_910._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_908 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e6859);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e6873);
  local_40a0 = (undefined1 **)&local_810;
  do {
    local_40a0 = local_40a0 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_40a0 != local_8f0);
  local_a80 = local_a78;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_a80 = (undefined8 *)local_a08;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_998 = local_a78;
  local_990 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e694a);
  __l_04._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_04._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_04,(allocator_type *)in_stack_ffffffffffffb358);
  local_a88 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[18],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [18])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_a98._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_a90 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e6a17);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e6a31);
  local_40d8 = (undefined1 **)&local_998;
  do {
    local_40d8 = local_40d8 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_40d8 != local_a78);
  local_c08 = local_c00;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_c08 = (undefined8 *)local_b90;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_b20 = local_c00;
  local_b18 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e6b08);
  __l_05._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_05._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_05,(allocator_type *)in_stack_ffffffffffffb358);
  local_c10 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[26],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [26])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_c20._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_c18 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e6bd5);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e6bef);
  local_4110 = (undefined1 **)&local_b20;
  do {
    local_4110 = local_4110 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4110 != local_c00);
  local_d90 = local_d88;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_d90 = (undefined8 *)local_d18;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_ca8 = local_d88;
  local_ca0 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e6cc6);
  __l_06._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_06._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_06,(allocator_type *)in_stack_ffffffffffffb358);
  local_d98 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[20],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [20])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_da8._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_da0 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e6d93);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e6dad);
  local_4148 = (undefined1 **)&local_ca8;
  do {
    local_4148 = local_4148 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4148 != local_d88);
  local_f18 = local_f10;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_f18 = (undefined8 *)local_ea0;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_e30 = local_f10;
  local_e28 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e6e84);
  __l_07._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_07._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_07,(allocator_type *)in_stack_ffffffffffffb358);
  local_f20 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[10],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [10])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_f30._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_f28 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e6f51);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e6f6b);
  local_4180 = (undefined1 **)&local_e30;
  do {
    local_4180 = local_4180 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4180 != local_f10);
  local_1110 = local_1108;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1110 = (undefined8 *)local_1098;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1110 = (undefined8 *)local_1028;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_fb8 = local_1108;
  local_fb0 = 3;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7060);
  __l_08._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_08._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_08,(allocator_type *)in_stack_ffffffffffffb358);
  local_1118 = 10;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[7],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [7])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_1128._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_1120 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e712d);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7147);
  local_41b8 = (undefined1 **)&local_fb8;
  do {
    local_41b8 = local_41b8 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_41b8 != local_1108);
  local_1298 = local_1290;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1298 = (undefined8 *)local_1220;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_11b0 = local_1290;
  local_11a8 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e721e);
  __l_09._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_09._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_09,(allocator_type *)in_stack_ffffffffffffb358);
  local_12a0 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[12],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [12])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_12b0._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_12a8 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e72eb);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7305);
  local_41f0 = (undefined1 **)&local_11b0;
  do {
    local_41f0 = local_41f0 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_41f0 != local_1290);
  local_1420 = local_1418;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1420 = (undefined8 *)local_13a8;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1338 = local_1418;
  local_1330 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e73dc);
  __l_10._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_10._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_10,(allocator_type *)in_stack_ffffffffffffb358);
  local_1428 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[19],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [19])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_1438._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_1430 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e74a9);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e74c3);
  local_4228 = (undefined1 **)&local_1338;
  do {
    local_4228 = local_4228 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4228 != local_1418);
  local_15a8 = local_15a0;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_15a8 = (undefined8 *)local_1530;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_14c0 = local_15a0;
  local_14b8 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e759a);
  __l_11._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_11._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_11,(allocator_type *)in_stack_ffffffffffffb358);
  local_15b0 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[18],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [18])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_15c0._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_15b8 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e7667);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7681);
  local_4260 = (undefined1 **)&local_14c0;
  do {
    local_4260 = local_4260 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4260 != local_15a0);
  local_1730 = local_1728;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1730 = (undefined8 *)local_16b8;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1648 = local_1728;
  local_1640 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7758);
  __l_12._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_12._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_12,(allocator_type *)in_stack_ffffffffffffb358);
  local_1738 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[18],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [18])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_1748._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_1740 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e7825);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e783f);
  local_4298 = (undefined1 **)&local_1648;
  do {
    local_4298 = local_4298 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4298 != local_1728);
  local_18b8 = local_18b0;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_18b8 = (undefined8 *)local_1840;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_17d0 = local_18b0;
  local_17c8 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7916);
  __l_13._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_13._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_13,(allocator_type *)in_stack_ffffffffffffb358);
  local_18c0 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[22],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [22])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_18d0._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_18c8 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e79e3);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e79fd);
  local_42d0 = (undefined1 **)&local_17d0;
  do {
    local_42d0 = local_42d0 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_42d0 != local_18b0);
  local_1a40 = local_1a38;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1a40 = (undefined8 *)local_19c8;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1958 = local_1a38;
  local_1950 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7ad4);
  __l_14._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_14._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_14,(allocator_type *)in_stack_ffffffffffffb358);
  local_1a48 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[15],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [15])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_1a58._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_1a50 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e7ba1);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7bbb);
  local_4308 = (undefined1 **)&local_1958;
  do {
    local_4308 = local_4308 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4308 != local_1a38);
  local_1bc8 = local_1bc0;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1bc8 = (undefined8 *)local_1b50;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1ae0 = local_1bc0;
  local_1ad8 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7c92);
  __l_15._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_15._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_15,(allocator_type *)in_stack_ffffffffffffb358);
  local_1bd0 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[11],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [11])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_1be0._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_1bd8 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e7d5f);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7d79);
  local_4340 = (undefined1 **)&local_1ae0;
  do {
    local_4340 = local_4340 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4340 != local_1bc0);
  local_1d50 = local_1d48;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1d50 = (undefined8 *)local_1cd8;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1c68 = local_1d48;
  local_1c60 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7e50);
  __l_16._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_16._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_16,(allocator_type *)in_stack_ffffffffffffb358);
  local_1d58 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[14],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [14])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_1d68._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_1d60 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e7f1d);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e7f37);
  local_4378 = (undefined1 **)&local_1c68;
  do {
    local_4378 = local_4378 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4378 != local_1d48);
  local_1ed8 = local_1ed0;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1ed8 = (undefined8 *)local_1e60;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1df0 = local_1ed0;
  local_1de8 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e800e);
  __l_17._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_17._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_17,(allocator_type *)in_stack_ffffffffffffb358);
  local_1ee0 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[24],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [24])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_1ef0._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_1ee8 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e80db);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e80f5);
  local_43b0 = (undefined1 **)&local_1df0;
  do {
    local_43b0 = local_43b0 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_43b0 != local_1ed0);
  local_2060 = local_2058;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_2060 = (undefined8 *)local_1fe8;
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_1f78 = local_2058;
  local_1f70 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e81cc);
  __l_18._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_18._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_18,(allocator_type *)in_stack_ffffffffffffb358);
  local_2068 = 2;
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[9],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [9])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                    *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  local_2078._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
       ._M_cur;
  local_2070 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e8299);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e82b3);
  local_43e8 = (undefined1 **)&local_1f78;
  do {
    local_43e8 = local_43e8 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_43e8 != local_2058);
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  ShaderStageSpecification::ShaderStageSpecification
            ((ShaderStageSpecification *)in_stack_ffffffffffffb360,in_stack_ffffffffffffb358);
  local_2100 = local_21e0;
  local_20f8 = 2;
  std::allocator<polyscope::render::ShaderStageSpecification>::allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e838a);
  __l_19._M_len = (size_type)in_stack_ffffffffffffb370;
  __l_19._M_array = in_stack_ffffffffffffb368;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)in_stack_ffffffffffffb360,__l_19,(allocator_type *)in_stack_ffffffffffffb358);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::pair<polyscope::DrawMode,_true>
            (in_stack_ffffffffffffb340,
             (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              *)in_stack_ffffffffffffb338,(DrawMode *)in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[25],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
              *)in_stack_ffffffffffffb370,(char (*) [25])in_stack_ffffffffffffb368,
             (pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
              *)in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
            *)in_stack_ffffffffffffb340,(value_type *)in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
           *)in_stack_ffffffffffffb330);
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::~pair((pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
           *)0x3e8457);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&in_stack_ffffffffffffb340->first);
  std::allocator<polyscope::render::ShaderStageSpecification>::~allocator
            ((allocator<polyscope::render::ShaderStageSpecification> *)0x3e8471);
  local_4420 = (undefined1 **)&local_2100;
  do {
    local_4420 = local_4420 + -0xe;
    ShaderStageSpecification::~ShaderStageSpecification
              ((ShaderStageSpecification *)in_stack_ffffffffffffb330);
  } while (local_4420 != local_21e0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[13],_true>
            (in_stack_ffffffffffffb370,(char (*) [13])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            (in_stack_ffffffffffffb370,(char (*) [23])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            (in_stack_ffffffffffffb370,(char (*) [21])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            (in_stack_ffffffffffffb370,(char (*) [21])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            (in_stack_ffffffffffffb370,(char (*) [21])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            (in_stack_ffffffffffffb370,(char (*) [21])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            (in_stack_ffffffffffffb370,(char (*) [23])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[28],_true>
            (in_stack_ffffffffffffb370,(char (*) [28])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[28],_true>
            (in_stack_ffffffffffffb370,(char (*) [28])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            (in_stack_ffffffffffffb370,(char (*) [25])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[19],_true>
            (in_stack_ffffffffffffb370,(char (*) [19])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[20],_true>
            (in_stack_ffffffffffffb370,(char (*) [20])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[19],_true>
            (in_stack_ffffffffffffb370,(char (*) [19])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[13],_true>
            (in_stack_ffffffffffffb370,(char (*) [13])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[15],_true>
            (in_stack_ffffffffffffb370,(char (*) [15])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[16],_true>
            (in_stack_ffffffffffffb370,(char (*) [16])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[12],_true>
            (in_stack_ffffffffffffb370,(char (*) [12])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            (in_stack_ffffffffffffb370,(char (*) [21])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[24],_true>
            (in_stack_ffffffffffffb370,(char (*) [24])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[18],_true>
            (in_stack_ffffffffffffb370,(char (*) [18])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            (in_stack_ffffffffffffb370,(char (*) [21])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[22],_true>
            (in_stack_ffffffffffffb370,(char (*) [22])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[26],_true>
            (in_stack_ffffffffffffb370,(char (*) [26])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[20],_true>
            (in_stack_ffffffffffffb370,(char (*) [20])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[15],_true>
            (in_stack_ffffffffffffb370,(char (*) [15])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[26],_true>
            (in_stack_ffffffffffffb370,(char (*) [26])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            (in_stack_ffffffffffffb370,(char (*) [21])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            (in_stack_ffffffffffffb370,(char (*) [21])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[22],_true>
            (in_stack_ffffffffffffb370,(char (*) [22])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            (in_stack_ffffffffffffb370,(char (*) [21])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[30],_true>
            (in_stack_ffffffffffffb370,(char (*) [30])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[20],_true>
            (in_stack_ffffffffffffb370,(char (*) [20])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            (in_stack_ffffffffffffb370,(char (*) [23])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[24],_true>
            (in_stack_ffffffffffffb370,(char (*) [24])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            (in_stack_ffffffffffffb370,(char (*) [23])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            (in_stack_ffffffffffffb370,(char (*) [21])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            (in_stack_ffffffffffffb370,(char (*) [23])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            (in_stack_ffffffffffffb370,(char (*) [25])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            (in_stack_ffffffffffffb370,(char (*) [25])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[31],_true>
            (in_stack_ffffffffffffb370,(char (*) [31])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            (in_stack_ffffffffffffb370,(char (*) [25])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[31],_true>
            (in_stack_ffffffffffffb370,(char (*) [31])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[24],_true>
            (in_stack_ffffffffffffb370,(char (*) [24])in_stack_ffffffffffffb368,
             in_stack_ffffffffffffb360);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
            *)in_stack_ffffffffffffb340,in_stack_ffffffffffffb338);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(in_stack_ffffffffffffb330);
  return;
}

Assistant:

void GLEngine::populateDefaultShadersAndRules() {
  // Note: we use .insert({key, value}) rather than map[key] = value to support const members in the value.

  // clang-format off

  // == Load general base shaders
  registeredShaderPrograms.insert({"MESH", {{FLEX_MESH_VERT_SHADER, FLEX_MESH_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"RAYCAST_SPHERE", {{FLEX_SPHERE_VERT_SHADER, FLEX_SPHERE_GEOM_SHADER, FLEX_SPHERE_FRAG_SHADER}, DrawMode::Points}});
  registeredShaderPrograms.insert({"RAYCAST_VECTOR", {{FLEX_VECTOR_VERT_SHADER, FLEX_VECTOR_GEOM_SHADER, FLEX_VECTOR_FRAG_SHADER}, DrawMode::Points}});
  registeredShaderPrograms.insert({"RAYCAST_CYLINDER", {{FLEX_CYLINDER_VERT_SHADER, FLEX_CYLINDER_GEOM_SHADER, FLEX_CYLINDER_FRAG_SHADER}, DrawMode::Points}});
  registeredShaderPrograms.insert({"HISTOGRAM", {{HISTOGRAM_VERT_SHADER, HISTOGRAM_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"GROUND_PLANE_TILE", {{GROUND_PLANE_VERT_SHADER, GROUND_PLANE_TILE_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"GROUND_PLANE_TILE_REFLECT", {{GROUND_PLANE_VERT_SHADER, GROUND_PLANE_TILE_REFLECT_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"GROUND_PLANE_SHADOW", {{GROUND_PLANE_VERT_SHADER, GROUND_PLANE_SHADOW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"MAP_LIGHT", {{TEXTURE_DRAW_VERT_SHADER, MAP_LIGHT_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"RIBBON", {{RIBBON_VERT_SHADER, RIBBON_GEOM_SHADER, RIBBON_FRAG_SHADER}, DrawMode::IndexedLineStripAdjacency}});
  registeredShaderPrograms.insert({"SLICE_PLANE", {{SLICE_PLANE_VERT_SHADER, SLICE_PLANE_FRAG_SHADER}, DrawMode::Triangles}});

  registeredShaderPrograms.insert({"TEXTURE_DRAW_PLAIN", {{TEXTURE_DRAW_VERT_SHADER, PLAIN_TEXTURE_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TEXTURE_DRAW_DOT3", {{TEXTURE_DRAW_VERT_SHADER, DOT3_TEXTURE_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TEXTURE_DRAW_MAP3", {{TEXTURE_DRAW_VERT_SHADER, MAP3_TEXTURE_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TEXTURE_DRAW_SPHEREBG", {{SPHEREBG_DRAW_VERT_SHADER, SPHEREBG_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"COMPOSITE_PEEL", {{TEXTURE_DRAW_VERT_SHADER, COMPOSITE_PEEL}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"DEPTH_COPY", {{TEXTURE_DRAW_VERT_SHADER, DEPTH_COPY}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"DEPTH_TO_MASK", {{TEXTURE_DRAW_VERT_SHADER, DEPTH_TO_MASK}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"SCALAR_TEXTURE_COLORMAP", {{TEXTURE_DRAW_VERT_SHADER, SCALAR_TEXTURE_COLORMAP}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"BLUR_RGB", {{TEXTURE_DRAW_VERT_SHADER, BLUR_RGB}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TRANSFORMATION_GIZMO_ROT", {{TRANSFORMATION_GIZMO_ROT_VERT, TRANSFORMATION_GIZMO_ROT_FRAG}, DrawMode::Triangles}});

  // === Load rules

  // Utility rules
  registeredShaderRules.insert({"GLSL_VERSION", GLSL_VERSION});
  registeredShaderRules.insert({"GLOBAL_FRAGMENT_FILTER", GLOBAL_FRAGMENT_FILTER});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_1", DOWNSAMPLE_RESOLVE_1});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_2", DOWNSAMPLE_RESOLVE_2});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_3", DOWNSAMPLE_RESOLVE_3});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_4", DOWNSAMPLE_RESOLVE_4});
  
  registeredShaderRules.insert({"TRANSPARENCY_STRUCTURE", TRANSPARENCY_STRUCTURE});
  registeredShaderRules.insert({"TRANSPARENCY_RESOLVE_SIMPLE", TRANSPARENCY_RESOLVE_SIMPLE});
  registeredShaderRules.insert({"TRANSPARENCY_PEEL_STRUCTURE", TRANSPARENCY_PEEL_STRUCTURE});
  registeredShaderRules.insert({"TRANSPARENCY_PEEL_GROUND", TRANSPARENCY_PEEL_GROUND});
  
  registeredShaderRules.insert({"GENERATE_WORLD_POS", GENERATE_WORLD_POS});
  registeredShaderRules.insert({"CULL_POS_FROM_WORLD", CULL_POS_FROM_WORLD});
  registeredShaderRules.insert({"CULL_POS_FROM_ATTR", CULL_POS_FROM_ATTR});

  // Lighting and shading things
  registeredShaderRules.insert({"LIGHT_MATCAP", LIGHT_MATCAP});
  registeredShaderRules.insert({"LIGHT_PASSTHRU", LIGHT_PASSTHRU});
  registeredShaderRules.insert({"SHADE_BASECOLOR", SHADE_BASECOLOR});
  registeredShaderRules.insert({"SHADE_COLOR", SHADE_COLOR});
  registeredShaderRules.insert({"SHADE_COLORMAP_VALUE", SHADE_COLORMAP_VALUE});
  registeredShaderRules.insert({"SHADE_COLORMAP_ANGULAR2", SHADE_COLORMAP_ANGULAR2});
  registeredShaderRules.insert({"SHADE_GRID_VALUE2", SHADE_GRID_VALUE2});
  registeredShaderRules.insert({"SHADE_CHECKER_VALUE2", SHADE_CHECKER_VALUE2});
  registeredShaderRules.insert({"SHADEVALUE_MAG_VALUE2", SHADEVALUE_MAG_VALUE2});
  registeredShaderRules.insert({"ISOLINE_STRIPE_VALUECOLOR", ISOLINE_STRIPE_VALUECOLOR});
  registeredShaderRules.insert({"CHECKER_VALUE2COLOR", CHECKER_VALUE2COLOR});

  // mesh things
  registeredShaderRules.insert({"MESH_WIREFRAME", MESH_WIREFRAME});
  registeredShaderRules.insert({"MESH_BACKFACE_NORMAL_FLIP", MESH_BACKFACE_NORMAL_FLIP});
  registeredShaderRules.insert({"MESH_BACKFACE_DARKEN", MESH_BACKFACE_DARKEN});
  registeredShaderRules.insert({"MESH_PROPAGATE_VALUE", MESH_PROPAGATE_VALUE});
  registeredShaderRules.insert({"MESH_PROPAGATE_VALUE2", MESH_PROPAGATE_VALUE2});
  registeredShaderRules.insert({"MESH_PROPAGATE_COLOR", MESH_PROPAGATE_COLOR});
  registeredShaderRules.insert({"MESH_PROPAGATE_HALFEDGE_VALUE", MESH_PROPAGATE_HALFEDGE_VALUE});
  registeredShaderRules.insert({"MESH_PROPAGATE_PICK", MESH_PROPAGATE_PICK});

  // sphere things
  registeredShaderRules.insert({"SPHERE_PROPAGATE_VALUE", SPHERE_PROPAGATE_VALUE});
  registeredShaderRules.insert({"SPHERE_PROPAGATE_VALUE2", SPHERE_PROPAGATE_VALUE2});
  registeredShaderRules.insert({"SPHERE_PROPAGATE_COLOR", SPHERE_PROPAGATE_COLOR});
  registeredShaderRules.insert({"SPHERE_VARIABLE_SIZE", SPHERE_VARIABLE_SIZE});

  // vector things
  registeredShaderRules.insert({"VECTOR_PROPAGATE_COLOR", VECTOR_PROPAGATE_COLOR});
  registeredShaderRules.insert({"TRANSFORMATION_GIZMO_VEC", TRANSFORMATION_GIZMO_VEC});

  // cylinder things
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_VALUE", CYLINDER_PROPAGATE_VALUE});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_BLEND_VALUE", CYLINDER_PROPAGATE_BLEND_VALUE});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_COLOR", CYLINDER_PROPAGATE_COLOR});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_BLEND_COLOR", CYLINDER_PROPAGATE_BLEND_COLOR});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_PICK", CYLINDER_PROPAGATE_PICK});

  // clang-format on
}